

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSharedDestructorCode
          (MessageGenerator *this,Printer *p)

{
  bool bVar1;
  long lVar2;
  allocator<char> local_4a5;
  allocator<char> local_4a4;
  allocator<char> local_4a3;
  allocator<char> local_4a2;
  allocator<char> local_4a1;
  Printer *p_local;
  _Any_data local_498;
  code *local_488;
  code *pcStack_480;
  undefined1 *local_478;
  undefined8 local_470;
  undefined1 local_468 [8];
  undefined8 uStack_460;
  undefined1 *local_458;
  undefined8 local_450;
  undefined1 local_448 [8];
  undefined8 uStack_440;
  undefined1 *local_438;
  undefined8 local_430;
  undefined1 local_428 [8];
  undefined8 uStack_420;
  undefined1 *local_418;
  undefined8 local_410;
  undefined1 local_408 [8];
  undefined8 uStack_400;
  undefined1 *local_3f8;
  undefined8 local_3f0;
  undefined1 local_3e8 [8];
  undefined8 uStack_3e0;
  anon_class_16_2_fd512ddd emit_field_dtors;
  undefined1 local_3c8 [64];
  char local_388;
  undefined1 *local_380;
  undefined8 local_378;
  undefined1 local_370 [16];
  undefined1 local_360;
  undefined1 local_318;
  undefined1 *local_310;
  undefined8 local_308;
  undefined1 local_300 [8];
  undefined8 uStack_2f8;
  variant<std::__cxx11::string,std::function<bool()>> local_2f0 [32];
  char local_2d0;
  undefined1 *local_2c8;
  undefined8 local_2c0;
  undefined1 local_2b8 [16];
  undefined1 local_2a8;
  undefined1 local_260;
  undefined1 *local_258;
  undefined8 local_250;
  undefined1 local_248 [8];
  undefined8 uStack_240;
  variant<std::__cxx11::string,std::function<bool()>> local_238 [32];
  char local_218;
  undefined1 *local_210;
  undefined8 local_208;
  undefined1 local_200 [16];
  undefined1 local_1f0;
  undefined1 local_1a8;
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [8];
  undefined8 uStack_188;
  variant<std::__cxx11::string,std::function<bool()>> local_180 [32];
  char local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_148 [16];
  undefined1 local_138;
  undefined1 local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  variant<std::__cxx11::string,std::function<bool()>> local_c8 [32];
  char local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  p_local = p;
  bVar1 = HasSimpleBaseClass(this->descriptor_,&this->options_);
  if (!bVar1) {
    emit_field_dtors.p = &p_local;
    emit_field_dtors.this = this;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3f8,"field_dtors",&local_4a1);
    local_3c8._0_8_ = local_3c8 + 0x10;
    if (local_3f8 == local_3e8) {
      local_3c8._24_8_ = uStack_3e0;
    }
    else {
      local_3c8._0_8_ = local_3f8;
    }
    local_3c8._8_8_ = local_3f0;
    local_3f0 = 0;
    local_498._8_8_ = 0;
    local_3e8[0] = 0;
    pcStack_480 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
    local_488 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_manager;
    local_498._M_unused._M_object = &emit_field_dtors;
    local_3f8 = local_3e8;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              ((variant<std::__cxx11::string,std::function<bool()>> *)(local_3c8 + 0x20),
               (function<bool_()> *)&local_498);
    std::_Function_base::~_Function_base((_Function_base *)&local_498);
    local_380 = local_370;
    local_378 = 0;
    local_370[0] = 0;
    local_360 = 0;
    if (local_388 == '\x01') {
      std::__cxx11::string::assign((char *)&local_380);
    }
    local_318 = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_418,"split_field_dtors",&local_4a2);
    local_310 = local_300;
    if (local_418 == local_408) {
      uStack_2f8 = uStack_400;
    }
    else {
      local_310 = local_418;
    }
    local_308 = local_410;
    local_410 = 0;
    local_408[0] = 0;
    local_488 = (code *)0x0;
    pcStack_480 = (code *)0x0;
    local_498._M_unused._M_object = (void *)0x0;
    local_498._8_8_ = 0;
    local_418 = local_408;
    local_498._M_unused._M_object = operator_new(0x20);
    *(MessageGenerator **)local_498._M_unused._0_8_ = this;
    *(Printer ***)((long)local_498._M_unused._0_8_ + 8) = &p_local;
    *(anon_class_16_2_fd512ddd **)((long)local_498._M_unused._0_8_ + 0x10) = &emit_field_dtors;
    *(code *)((long)local_498._M_unused._0_8_ + 0x18) = (code)0x0;
    pcStack_480 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
    local_488 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_manager;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              (local_2f0,(function<bool_()> *)&local_498);
    std::_Function_base::~_Function_base((_Function_base *)&local_498);
    local_2c8 = local_2b8;
    local_2c0 = 0;
    local_2b8[0] = 0;
    local_2a8 = 0;
    if (local_2d0 == '\x01') {
      std::__cxx11::string::assign((char *)&local_2c8);
    }
    local_260 = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_438,"oneof_field_dtors",&local_4a3);
    local_258 = local_248;
    if (local_438 == local_428) {
      uStack_240 = uStack_420;
    }
    else {
      local_258 = local_438;
    }
    local_250 = local_430;
    local_430 = 0;
    local_428[0] = 0;
    local_488 = (code *)0x0;
    pcStack_480 = (code *)0x0;
    local_498._M_unused._M_object = (void *)0x0;
    local_498._8_8_ = 0;
    local_438 = local_428;
    local_498._M_unused._M_object = operator_new(0x18);
    *(MessageGenerator **)local_498._M_unused._0_8_ = this;
    *(Printer ***)((long)local_498._M_unused._0_8_ + 8) = &p_local;
    *(code *)((long)local_498._M_unused._0_8_ + 0x10) = (code)0x0;
    pcStack_480 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
    local_488 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_manager;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              (local_238,(function<bool_()> *)&local_498);
    std::_Function_base::~_Function_base((_Function_base *)&local_498);
    local_210 = local_200;
    local_208 = 0;
    local_200[0] = 0;
    local_1f0 = 0;
    if (local_218 == '\x01') {
      std::__cxx11::string::assign((char *)&local_210);
    }
    local_1a8 = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_458,"weak_fields_dtor",&local_4a4);
    local_1a0 = local_190;
    if (local_458 == local_448) {
      uStack_188 = uStack_440;
    }
    else {
      local_1a0 = local_458;
    }
    local_198 = local_450;
    local_450 = 0;
    local_448[0] = 0;
    local_488 = (code *)0x0;
    pcStack_480 = (code *)0x0;
    local_498._M_unused._M_object = (void *)0x0;
    local_498._8_8_ = 0;
    local_458 = local_448;
    local_498._M_unused._M_object = operator_new(0x18);
    *(MessageGenerator **)local_498._M_unused._0_8_ = this;
    *(Printer ***)((long)local_498._M_unused._0_8_ + 8) = &p_local;
    *(code *)((long)local_498._M_unused._0_8_ + 0x10) = (code)0x0;
    pcStack_480 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
    local_488 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_manager;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              (local_180,(function<bool_()> *)&local_498);
    std::_Function_base::~_Function_base((_Function_base *)&local_498);
    local_158 = local_148;
    local_150 = 0;
    local_148[0] = 0;
    local_138 = 0;
    if (local_160 == '\x01') {
      std::__cxx11::string::assign((char *)&local_158);
    }
    local_f0 = 0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_478,"impl_dtor",&local_4a5);
    local_e0 = local_470;
    local_e8 = local_d8;
    if (local_478 == local_468) {
      uStack_d0 = uStack_460;
    }
    else {
      local_e8 = local_478;
    }
    local_470 = 0;
    local_468[0] = 0;
    local_498._8_8_ = 0;
    local_498._M_unused._M_object = &p_local;
    pcStack_480 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
    local_488 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_manager;
    local_478 = local_468;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              (local_c8,(function<bool_()> *)&local_498);
    std::_Function_base::~_Function_base((_Function_base *)&local_498);
    local_a0 = local_90;
    local_98 = 0;
    local_90[0] = 0;
    local_80 = 0;
    if (local_a8 == '\x01') {
      std::__cxx11::string::assign((char *)&local_a0);
    }
    local_38 = 0;
    google::protobuf::io::Printer::Emit
              (p,local_3c8,5,0x1b5,
               "\n        inline void $classname$::SharedDtor(MessageLite& self) {\n          $classname$& this_ = static_cast<$classname$&>(self);\n          this_._internal_metadata_.Delete<$unknown_fields_type$>();\n          $DCHK$(this_.GetArena() == nullptr);\n          $WeakDescriptorSelfPin$;\n          $field_dtors$;\n          $split_field_dtors$;\n          $oneof_field_dtors$;\n          $weak_fields_dtor$;\n          $impl_dtor$;\n        }\n      "
              );
    lVar2 = 0x2e0;
    do {
      io::Printer::Sub::~Sub((Sub *)(local_3c8 + lVar2));
      lVar2 = lVar2 + -0xb8;
    } while (lVar2 != -0xb8);
    std::__cxx11::string::~string((string *)&local_478);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_438);
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::string::~string((string *)&local_3f8);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateSharedDestructorCode(io::Printer* p) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  auto emit_field_dtors = [&](bool split_fields) {
    // Write the destructors for each field except oneof members.
    // optimized_order_ does not contain oneof fields.
    for (const auto* field : optimized_order_) {
      if (ShouldSplit(field, options_) != split_fields) continue;
      field_generators_.get(field).GenerateDestructorCode(p);
    }
  };
  p->Emit(
      {
          {"field_dtors", [&] { emit_field_dtors(/* split_fields= */ false); }},
          {"split_field_dtors",
           [&] {
             if (!ShouldSplit(descriptor_, options_)) return;
             p->Emit(
                 {
                     {"split_field_dtors_impl",
                      [&] { emit_field_dtors(/* split_fields= */ true); }},
                 },
                 R"cc(
                   if (PROTOBUF_PREDICT_FALSE(!this_.IsSplitMessageDefault())) {
                     auto* $cached_split_ptr$ = this_.$split$;
                     $split_field_dtors_impl$;
                     delete $cached_split_ptr$;
                   }
                 )cc");
           }},
          {"oneof_field_dtors",
           [&] {
             for (const auto* oneof : OneOfRange(descriptor_)) {
               p->Emit({{"name", oneof->name()}},
                       R"cc(
                         if (this_.has_$name$()) {
                           this_.clear_$name$();
                         }
                       )cc");
             }
           }},
          {"weak_fields_dtor",
           [&] {
             if (num_weak_fields_ == 0) return;
             // Generate code to destruct oneofs. Clearing should do the work.
             p->Emit(R"cc(
               this_.$weak_field_map$.ClearAll();
             )cc");
           }},
          {"impl_dtor", [&] { p->Emit("this_._impl_.~Impl_();\n"); }},
      },
      R"cc(
        inline void $classname$::SharedDtor(MessageLite& self) {
          $classname$& this_ = static_cast<$classname$&>(self);
          this_._internal_metadata_.Delete<$unknown_fields_type$>();
          $DCHK$(this_.GetArena() == nullptr);
          $WeakDescriptorSelfPin$;
          $field_dtors$;
          $split_field_dtors$;
          $oneof_field_dtors$;
          $weak_fields_dtor$;
          $impl_dtor$;
        }
      )cc");
}